

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O3

bool __thiscall Clasp::ImpliedList::assign(ImpliedList *this,Solver *s)

{
  uint uVar1;
  size_type sVar2;
  undefined8 uVar3;
  ulong uVar4;
  uint uVar5;
  pointer pIVar6;
  uint uVar7;
  pointer pIVar8;
  long lVar9;
  AnteInfo *a;
  bool bVar10;
  
  uVar1 = (s->levels_).super_type.ebo_.size;
  sVar2 = (s->conflict_).ebo_.size;
  bVar10 = sVar2 == 0;
  pIVar6 = (this->lits).ebo_.buf;
  uVar7 = this->front;
  uVar4 = (ulong)uVar7;
  pIVar8 = pIVar6 + uVar4;
  uVar5 = (this->lits).ebo_.size;
  if (uVar7 != uVar5) {
    bVar10 = sVar2 == 0;
    a = &pIVar6[uVar4].ante;
    lVar9 = (ulong)uVar5 * 0x18 + uVar4 * -0x18;
    do {
      uVar5 = *(uint *)((long)(a + -1) + 0xc);
      if (uVar5 <= uVar1) {
        if (bVar10 == false) {
          bVar10 = false;
        }
        else {
          bVar10 = Solver::force(s,(Literal *)((long)(a + -1) + 8),(Antecedent *)a,
                                 (a->super_pair<Clasp::Antecedent,_unsigned_int>).second);
          uVar5 = *(uint *)((long)(a + -1) + 0xc);
        }
        if ((uVar5 < uVar1) || ((a->super_pair<Clasp::Antecedent,_unsigned_int>).first.data_ == 0))
        {
          uVar3 = *(undefined8 *)((long)(a + -1) + 8);
          pIVar8->lit = (Literal)(int)uVar3;
          pIVar8->level = (int)((ulong)uVar3 >> 0x20);
          (pIVar8->ante).super_pair<Clasp::Antecedent,_unsigned_int>.first.data_ =
               (a->super_pair<Clasp::Antecedent,_unsigned_int>).first.data_;
          (pIVar8->ante).super_pair<Clasp::Antecedent,_unsigned_int>.second =
               (a->super_pair<Clasp::Antecedent,_unsigned_int>).second;
          pIVar8 = pIVar8 + 1;
        }
      }
      a = (AnteInfo *)((long)(a + 1) + 8);
      lVar9 = lVar9 + -0x18;
    } while (lVar9 != 0);
    pIVar6 = (this->lits).ebo_.buf;
    uVar4 = (ulong)(this->lits).ebo_.size;
    uVar7 = this->front;
  }
  uVar5 = (int)((long)pIVar6 + (uVar4 * 0x18 - (long)pIVar8) >> 3) * 0x55555555 + (int)uVar4;
  if (uVar5 == 0) {
    uVar1 = 0;
  }
  (this->lits).ebo_.size = uVar5;
  this->level = uVar1;
  if ((s->levels_).root < uVar1) {
    uVar5 = uVar7;
  }
  this->front = uVar5;
  return bVar10;
}

Assistant:

bool ImpliedList::assign(Solver& s) {
	assert(front <= lits.size());
	bool ok             = !s.hasConflict();
	const uint32 DL     = s.decisionLevel();
	VecType::iterator j = lits.begin() + front;
	for (VecType::iterator it = j, end = lits.end(); it != end; ++it) {
		if(it->level <= DL) {
			ok = ok && s.force(it->lit, it->ante.ante(), it->ante.data());
			if (it->level < DL || it->ante.ante().isNull()) { *j++ = *it; }
		}
	}
	lits.erase(j, lits.end());
	level = DL * uint32(!lits.empty());
	front = level > s.rootLevel() ? front  : sizeVec(lits);
	return ok;
}